

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adau1462.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *__s;
  long lVar2;
  char buf [8];
  
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\x01';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  puts("ADAU1462 init ");
  iVar1 = spi_open(argc,argv);
  if (iVar1 == 0) {
    default_download_IC_1();
    spi_read(0x2c9,4,(uint8_t *)buf);
    printf("init done and read address %x:\n",0x2c9);
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      printf(" %.2x",(ulong)(uint)(int)buf[lVar2]);
    }
    putchar(10);
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      buf[lVar2] = '\0';
    }
    spi_read(0x2ca,8,(uint8_t *)buf);
    printf("init done and read address %x:\n",0x2ca);
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      printf(" %.2x",(ulong)(uint)(int)buf[lVar2]);
    }
    putchar(10);
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      buf[lVar2] = '\0';
    }
    __s = "ADAU1462 Init finish";
  }
  else {
    __s = "ADAU166 Init failed!!!";
  }
  puts(__s);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	int i;
	char buf[8] = {0, 0, 0, 0, 1};
	printf("ADAU1462 init \n");
	if(0 != spi_backend_ops.open(argc, argv))
	{
		printf("ADAU166 Init failed!!!\n");
		return 0;
	}
	default_download_IC_1();

	spi_backend_ops.read(DSP_VOLUME_CONTROL_1, 4, buf);
	printf("init done and read address %x:\n",DSP_VOLUME_CONTROL_1);
        for(i = 0; i < 4; i++)
        printf(" %.2x",buf[i]);
        printf("\n");
	
	for(i = 0; i < 8; i++)
                buf[i] = 0;

	spi_backend_ops.read(DSP_VOLUME_CONTROL_2, 8, buf);
        printf("init done and read address %x:\n",DSP_VOLUME_CONTROL_2);
        for(i = 0; i < 8; i++)
        printf(" %.2x",buf[i]);
        printf("\n");

        for(i = 0; i < 8; i++)
                buf[i] = 0;
   printf("ADAU1462 Init finish\n");
   return 0;
}